

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

CopyStatus adios2sys::SystemTools::CopyFileContentBlockwise(string *source,string *destination)

{
  CopyStatus CVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  long lVar6;
  Status SVar7;
  char buffer [4096];
  int bufferSize;
  ofstream fout;
  ifstream fin;
  string *in_stack_ffffffffffffeb08;
  undefined1 local_1458 [4100];
  undefined4 local_454;
  Status local_450;
  long local_448 [64];
  Status local_248;
  undefined4 local_240;
  Status local_23c;
  long local_228 [67];
  CopyStatus local_c;
  
  pcVar5 = (char *)std::__cxx11::string::c_str();
  _Var4 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_228,pcVar5,_Var4);
  bVar2 = std::ios::operator!((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    local_248 = RemoveFile(in_stack_ffffffffffffeb08);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_out,_S_trunc);
    _Var4 = std::operator|(_Var4,_S_bin);
    std::ofstream::ofstream(local_448,pcVar5,_Var4);
    bVar2 = std::ios::operator!((ios *)((long)local_448 + *(long *)(local_448[0] + -0x18)));
    if ((bVar2 & 1) == 0) {
      while (bVar3 = std::ios::operator_cast_to_bool
                               ((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18))), bVar3)
      {
        local_454 = 0x1000;
        std::istream::read((char *)local_228,(long)local_1458);
        lVar6 = std::istream::gcount();
        if (lVar6 == 0) break;
        std::istream::gcount();
        std::ostream::write((char *)local_448,(long)local_1458);
      }
      std::ostream::flush();
      std::ifstream::close();
      std::ofstream::close();
      bVar2 = std::ios::operator!((ios *)((long)local_448 + *(long *)(local_448[0] + -0x18)));
      if ((bVar2 & 1) == 0) {
        SVar7 = Status::Success();
        CopyStatus::CopyStatus(&local_c,SVar7,NoPath);
      }
      else {
        SVar7 = Status::POSIX_errno();
        CopyStatus::CopyStatus(&local_c,SVar7,DestPath);
      }
    }
    else {
      local_450 = Status::POSIX_errno();
      CopyStatus::CopyStatus(&local_c,local_450,DestPath);
    }
    local_240 = 1;
    std::ofstream::~ofstream(local_448);
  }
  else {
    local_23c = Status::POSIX_errno();
    CopyStatus::CopyStatus(&local_c,local_23c,SourcePath);
    local_240 = 1;
  }
  std::ifstream::~ifstream(local_228);
  CVar1.Path = local_c.Path;
  CVar1.super_Status = local_c.super_Status;
  return CVar1;
}

Assistant:

SystemTools::CopyStatus SystemTools::CopyFileContentBlockwise(
  std::string const& source, std::string const& destination)
{
  // Open files
  kwsys::ifstream fin(source.c_str(), std::ios::in | std::ios::binary);
  if (!fin) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::SourcePath };
  }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(destination);

  kwsys::ofstream fout(destination.c_str(),
                       std::ios::out | std::ios::trunc | std::ios::binary);
  if (!fout) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while (fin) {
    const int bufferSize = 4096;
    char buffer[bufferSize];

    fin.read(buffer, bufferSize);
    if (fin.gcount()) {
      fout.write(buffer, fin.gcount());
    } else {
      break;
    }
  }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if (!fout) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }

  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
}